

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::ResolveClips(LWOImporter *this)

{
  Type TVar1;
  ulong uVar2;
  Logger *pLVar3;
  ulong uVar4;
  pointer pCVar5;
  uint uVar6;
  pointer pCVar7;
  
  uVar6 = 0;
  while( true ) {
    uVar4 = (ulong)uVar6;
    pCVar5 = (this->mClips).
             super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->mClips).
                   super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)pCVar5) / 0x38;
    if (uVar2 <= uVar4) break;
    if (pCVar5[uVar4].type == REF) {
      pCVar7 = pCVar5 + uVar4;
      uVar4 = (ulong)pCVar7->clipRef;
      if (uVar2 <= uVar4) {
        pLVar3 = DefaultLogger::get();
        Logger::error(pLVar3,"LWO2: Clip referrer index is out of range");
        pCVar7->clipRef = 0;
        pCVar5 = (this->mClips).
                 super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = 0;
      }
      if (pCVar5[uVar4].type == REF) {
        pLVar3 = DefaultLogger::get();
        Logger::error(pLVar3,"LWO2: Clip references another clip reference");
        TVar1 = UNSUPPORTED;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&pCVar7->path);
        TVar1 = pCVar5[uVar4].type;
      }
      pCVar7->type = TVar1;
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void LWOImporter::ResolveClips()
{
    for( unsigned int i = 0; i < mClips.size();++i) {

        Clip& clip = mClips[i];
        if (Clip::REF == clip.type) {

            if (clip.clipRef >= mClips.size())  {
                ASSIMP_LOG_ERROR("LWO2: Clip referrer index is out of range");
                clip.clipRef = 0;
            }

            Clip& dest = mClips[clip.clipRef];
            if (Clip::REF == dest.type) {
                ASSIMP_LOG_ERROR("LWO2: Clip references another clip reference");
                clip.type = Clip::UNSUPPORTED;
            }

            else    {
                clip.path = dest.path;
                clip.type = dest.type;
            }
        }
    }
}